

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O3

void __thiscall Ptex::v2_4::PtexMainWriter::finish(PtexMainWriter *this)

{
  uint64_t *puVar1;
  pointer pFVar2;
  pointer data;
  pointer pLVar3;
  void *data_00;
  bool bVar4;
  _Alloc_hider _Var5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  uint32_t uVar9;
  uint uVar10;
  undefined4 extraout_var;
  char *pcVar12;
  long *plVar13;
  FILE *pFVar14;
  ulong uVar15;
  uint64_t uVar16;
  char *in_RCX;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong uVar21;
  vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> levelinfo;
  allocator_type local_69;
  FILE *local_68;
  string local_60;
  __off_t local_40;
  ulong local_38;
  byte *pbVar11;
  undefined4 extraout_var_00;
  
  if (this->_hasNewData == true) {
    uVar10 = (this->super_PtexWriterBase)._header.nfaces;
    if (this->_reader == (PtexReader *)0x0) {
      if (0 < (int)uVar10) {
        pFVar2 = (this->_faceinfo).
                 super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        in_RCX = (char *)((ulong)uVar10 * 0x14);
        pcVar12 = (char *)0x0;
        do {
          if (pcVar12[(long)&pFVar2->flags] == -1) {
            pcVar12[(long)&pFVar2->flags] = '\x01';
          }
          pcVar12 = pcVar12 + 0x14;
        } while (in_RCX != pcVar12);
      }
    }
    else if (0 < (int)uVar10) {
      lVar18 = 3;
      uVar21 = 0;
      do {
        if (*(char *)((long)((this->_faceinfo).
                             super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start)->adjfaces + lVar18 + -4) ==
            -1) {
          iVar8 = (*(this->_reader->super_PtexTexture)._vptr_PtexTexture[0x10])
                            (this->_reader,uVar21 & 0xffffffff);
          pbVar11 = (byte *)CONCAT44(extraout_var,iVar8);
          if ((pbVar11[3] & 1) == 0) {
            pcVar12 = (char *)operator_new__((long)((1 << (*pbVar11 & 0x1f)) << (pbVar11[1] & 0x1f))
                                             * (long)(this->super_PtexWriterBase)._pixelSize);
            (*(this->_reader->super_PtexTexture)._vptr_PtexTexture[0x11])
                      (this->_reader,uVar21 & 0xffffffff,pcVar12,0);
            in_RCX = pcVar12;
            (*(this->super_PtexWriterBase).super_PtexWriter._vptr_PtexWriter[0xc])
                      (this,uVar21 & 0xffffffff,pbVar11,pcVar12,0);
            operator_delete__(pcVar12);
          }
          else {
            iVar8 = (*(this->_reader->super_PtexTexture)._vptr_PtexTexture[0x13])
                              (this->_reader,uVar21 & 0xffffffff);
            plVar13 = (long *)CONCAT44(extraout_var_00,iVar8);
            if (plVar13 != (long *)0x0) {
              in_RCX = (char *)(**(code **)(*plVar13 + 0x30))(plVar13);
              (*(this->super_PtexWriterBase).super_PtexWriter._vptr_PtexWriter[0xd])
                        (this,uVar21 & 0xffffffff,pbVar11);
              (**(code **)(*plVar13 + 0x10))(plVar13);
            }
          }
        }
        uVar21 = uVar21 + 1;
        lVar18 = lVar18 + 0x14;
      } while (uVar10 != uVar21);
    }
    if (this->_genmipmaps == true) {
      generateReductions(this);
    }
    flagConstantNeighorhoods(this);
    (this->super_PtexWriterBase)._header.nlevels =
         (short)((uint)(*(int *)&(this->_levels).
                                 super__Vector_base<Ptex::v2_4::PtexMainWriter::LevelRec,_std::allocator<Ptex::v2_4::PtexMainWriter::LevelRec>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                       *(int *)&(this->_levels).
                                super__Vector_base<Ptex::v2_4::PtexMainWriter::LevelRec,_std::allocator<Ptex::v2_4::PtexMainWriter::LevelRec>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x5555;
    pcVar12 = (this->_newpath)._M_dataplus._M_p;
    (this->super_PtexWriterBase)._header.nfaces =
         (int)((ulong)((long)(this->_faceinfo).
                             super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_faceinfo).
                            super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333;
    pFVar14 = fopen(pcVar12,"wb+");
    if (pFVar14 == (FILE *)0x0) {
      (anonymous_namespace)::fileError_abi_cxx11_
                (&local_60,(_anonymous_namespace_ *)"Can\'t write to ptex file: ",
                 (this->_newpath)._M_dataplus._M_p,in_RCX);
      std::__cxx11::string::_M_assign((string *)&(this->super_PtexWriterBase)._error);
      (this->super_PtexWriterBase)._ok = false;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return;
      }
      uVar21 = local_60.field_2._M_allocated_capacity + 1;
    }
    else {
      bVar6 = (this->super_PtexWriterBase)._ok;
      local_68 = pFVar14;
      if ((bool)bVar6 == true) {
        uVar10 = 0x40;
        do {
          uVar17 = 0x4000;
          if (uVar10 < 0x4000) {
            uVar17 = uVar10;
          }
          iVar8 = PtexWriterBase::writeBlock
                            (&this->super_PtexWriterBase,(FILE *)pFVar14,
                             PtexWriterBase::writeBlank::zeros,uVar17);
          uVar17 = uVar10 - iVar8;
          bVar4 = iVar8 <= (int)uVar10;
          uVar10 = uVar17;
        } while (uVar17 != 0 && bVar4);
        bVar6 = (this->super_PtexWriterBase)._ok;
      }
      pFVar14 = local_68;
      if ((bVar6 & 1) != 0) {
        uVar10 = 0x28;
        do {
          uVar17 = 0x4000;
          if (uVar10 < 0x4000) {
            uVar17 = uVar10;
          }
          iVar8 = PtexWriterBase::writeBlock
                            (&this->super_PtexWriterBase,(FILE *)pFVar14,
                             PtexWriterBase::writeBlank::zeros,uVar17);
          uVar17 = uVar10 - iVar8;
          bVar4 = iVar8 <= (int)uVar10;
          uVar10 = uVar17;
        } while (uVar17 != 0 && bVar4);
      }
      uVar9 = PtexWriterBase::writeZipBlock
                        (&this->super_PtexWriterBase,(FILE *)pFVar14,
                         (this->_faceinfo).
                         super__Vector_base<Ptex::v2_4::FaceInfo,_std::allocator<Ptex::v2_4::FaceInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->super_PtexWriterBase)._header.nfaces * 0x14,true);
      (this->super_PtexWriterBase)._header.faceinfosize = uVar9;
      data = (this->_constdata).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
      uVar9 = PtexWriterBase::writeZipBlock
                        (&this->super_PtexWriterBase,(FILE *)pFVar14,data,
                         *(int *)&(this->_constdata).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (int)data,true);
      (this->super_PtexWriterBase)._header.constdatasize = uVar9;
      local_40 = ftello(pFVar14);
      uVar7 = (this->super_PtexWriterBase)._header.nlevels;
      if ((uVar7 != 0 & (this->super_PtexWriterBase)._ok) == 1) {
        uVar10 = (uint)uVar7 << 4;
        do {
          uVar17 = 0x4000;
          if (uVar10 < 0x4000) {
            uVar17 = uVar10;
          }
          iVar8 = PtexWriterBase::writeBlock
                            (&this->super_PtexWriterBase,(FILE *)pFVar14,
                             PtexWriterBase::writeBlank::zeros,uVar17);
          uVar17 = uVar10 - iVar8;
          bVar4 = iVar8 <= (int)uVar10;
          uVar10 = uVar17;
        } while (uVar17 != 0 && bVar4);
        uVar7 = (this->super_PtexWriterBase)._header.nlevels;
      }
      std::vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>::vector
                ((vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> *)&local_60,
                 (ulong)uVar7,&local_69);
      if ((this->super_PtexWriterBase)._header.nlevels != 0) {
        uVar21 = 0;
        do {
          _Var5._M_p = local_60._M_dataplus._M_p;
          pLVar3 = (this->_levels).
                   super__Vector_base<Ptex::v2_4::PtexMainWriter::LevelRec,_std::allocator<Ptex::v2_4::PtexMainWriter::LevelRec>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          data_00 = pLVar3[uVar21].fdh.
                    super__Vector_base<Ptex::v2_4::FaceDataHeader,_std::allocator<Ptex::v2_4::FaceDataHeader>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar17 = (uint)((ulong)((long)pLVar3[uVar21].fdh.
                                        super__Vector_base<Ptex::v2_4::FaceDataHeader,_std::allocator<Ptex::v2_4::FaceDataHeader>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)data_00)
                         >> 2);
          *(uint *)(local_60._M_dataplus._M_p + uVar21 * 0x10 + 0xc) = uVar17;
          local_38 = uVar21;
          uVar10 = PtexWriterBase::writeZipBlock
                             (&this->super_PtexWriterBase,(FILE *)pFVar14,data_00,uVar17 * 4,true);
          pFVar14 = local_68;
          puVar20 = (ulong *)(_Var5._M_p + uVar21 * 0x10);
          *(uint *)(puVar20 + 1) = uVar10;
          uVar15 = (ulong)uVar10;
          *puVar20 = uVar15;
          if (0 < (int)uVar17) {
            uVar19 = 0;
            do {
              iVar8 = PtexWriterBase::copyBlock
                                (&this->super_PtexWriterBase,(FILE *)pFVar14,this->_tmpfp,
                                 *(FilePos *)
                                  (*(long *)&pLVar3[uVar21].pos.
                                             super__Vector_base<long,_std::allocator<long>_>._M_impl
                                  + uVar19 * 8),
                                 *(uint *)(*(long *)&pLVar3[uVar21].fdh.
                                                                                                          
                                                  super__Vector_base<Ptex::v2_4::FaceDataHeader,_std::allocator<Ptex::v2_4::FaceDataHeader>_>
                                                  ._M_impl.super__Vector_impl_data + uVar19 * 4) &
                                 0x3fffffff);
              uVar15 = (long)iVar8 + *puVar20;
              *puVar20 = uVar15;
              uVar19 = uVar19 + 1;
            } while ((uVar17 & 0x7fffffff) != uVar19);
          }
          puVar1 = &(this->super_PtexWriterBase)._header.leveldatasize;
          *puVar1 = *puVar1 + uVar15;
          uVar21 = local_38 + 1;
        } while (uVar21 < (this->super_PtexWriterBase)._header.nlevels);
      }
      rewind((FILE *)this->_tmpfp);
      if ((this->super_PtexWriterBase)._metadata.
          super__Vector_base<Ptex::v2_4::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_4::PtexWriterBase::MetaEntry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->super_PtexWriterBase)._metadata.
          super__Vector_base<Ptex::v2_4::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_4::PtexWriterBase::MetaEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        writeMetaData(this,(FILE *)pFVar14);
      }
      uVar16 = ftello(pFVar14);
      (this->super_PtexWriterBase)._extheader.editdatapos = uVar16;
      fseeko(pFVar14,local_40,0);
      uVar9 = PtexWriterBase::writeBlock
                        (&this->super_PtexWriterBase,(FILE *)pFVar14,local_60._M_dataplus._M_p,
                         (uint)(this->super_PtexWriterBase)._header.nlevels << 4);
      (this->super_PtexWriterBase)._header.levelinfosize = uVar9;
      fseeko(pFVar14,0,0);
      PtexWriterBase::writeBlock
                (&this->super_PtexWriterBase,(FILE *)pFVar14,&(this->super_PtexWriterBase)._header,
                 0x40);
      PtexWriterBase::writeBlock
                (&this->super_PtexWriterBase,(FILE *)pFVar14,
                 &(this->super_PtexWriterBase)._extheader,0x28);
      fclose(pFVar14);
      if (local_60._M_dataplus._M_p == (pointer)0x0) {
        return;
      }
      uVar21 = local_60.field_2._M_allocated_capacity - (long)local_60._M_dataplus._M_p;
    }
    operator_delete(local_60._M_dataplus._M_p,uVar21);
  }
  return;
}

Assistant:

void PtexMainWriter::finish()
{
    // do nothing if there's no new data to write
    if (!_hasNewData) return;

    // copy missing faces from _reader
    if (_reader) {
        for (int i = 0, nfaces = _header.nfaces; i < nfaces; i++) {
            if (_faceinfo[i].flags == uint8_t(-1)) {
                // copy face data
                const Ptex::FaceInfo& info = _reader->getFaceInfo(i);
                int size = _pixelSize * info.res.size();
                if (info.isConstant()) {
                    PtexPtr<PtexFaceData> data ( _reader->getData(i) );
                    if (data) {
                        writeConstantFace(i, info, data->getData());
                    }
                } else {
                    char* data = new char [size];
                    _reader->getData(i, data, 0);
                    writeFace(i, info, data, 0);
                    delete [] data;
                }
            }
        }
    }
    else {
        // just flag missing faces as constant (black)
        for (int i = 0, nfaces = _header.nfaces; i < nfaces; i++) {
            if (_faceinfo[i].flags == uint8_t(-1))
                _faceinfo[i].flags = FaceInfo::flag_constant;
        }
    }

    // write reductions to tmp file
    if (_genmipmaps)
        generateReductions();

    // flag faces w/ constant neighborhoods
    flagConstantNeighorhoods();

    // update header
    _header.nlevels = uint16_t(_levels.size());
    _header.nfaces = uint32_t(_faceinfo.size());

    // create new file
    FILE* newfp = fopen(_newpath.c_str(), "wb+");
    if (!newfp) {
        setError(fileError("Can't write to ptex file: ", _newpath.c_str()));
        return;
    }

    // write blank header (to fill in later)
    writeBlank(newfp, HeaderSize);
    writeBlank(newfp, ExtHeaderSize);

    // write compressed face info block
    _header.faceinfosize = writeZipBlock(newfp, &_faceinfo[0],
                                         (int)sizeof(FaceInfo)*_header.nfaces);

    // write compressed const data block
    _header.constdatasize = writeZipBlock(newfp, &_constdata[0], int(_constdata.size()));

    // write blank level info block (to fill in later)
    FilePos levelInfoPos = ftello(newfp);
    writeBlank(newfp, LevelInfoSize * _header.nlevels);

    // write level data blocks (and record level info)
    std::vector<LevelInfo> levelinfo(_header.nlevels);
    for (int li = 0; li < _header.nlevels; li++)
    {
        LevelInfo& info = levelinfo[li];
        LevelRec& level = _levels[li];
        int nfaces = int(level.fdh.size());
        info.nfaces = nfaces;
        // output compressed level data header
        info.levelheadersize = writeZipBlock(newfp, &level.fdh[0],
                                             (int)sizeof(FaceDataHeader)*nfaces);
        info.leveldatasize = info.levelheadersize;
        // copy level data from tmp file
        for (int fi = 0; fi < nfaces; fi++)
            info.leveldatasize += copyBlock(newfp, _tmpfp, level.pos[fi],
                                            level.fdh[fi].blocksize());
        _header.leveldatasize += info.leveldatasize;
    }
    rewind(_tmpfp);

    // write meta data (if any)
    if (!_metadata.empty())
        writeMetaData(newfp);

    // update extheader for edit data position
    _extheader.editdatapos = ftello(newfp);

    // rewrite level info block
    fseeko(newfp, levelInfoPos, SEEK_SET);
    _header.levelinfosize = writeBlock(newfp, &levelinfo[0], LevelInfoSize*_header.nlevels);

    // rewrite header
    fseeko(newfp, 0, SEEK_SET);
    writeBlock(newfp, &_header, HeaderSize);
    writeBlock(newfp, &_extheader, ExtHeaderSize);
    fclose(newfp);
}